

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

Rune * duckdb_re2::Regexp::LeadingString(Regexp *re,int *nrune,ParseFlags *flags)

{
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar1;
  uint8_t uVar2;
  
  uVar2 = re->op_;
  do {
    if (uVar2 != '\x05') {
      *flags = re->parse_flags_ & FoldCase;
      if (uVar2 == '\x04') {
        *nrune = (re->arguments).repeat.max_;
        return (Rune *)(re->arguments).capture.name_;
      }
      if (uVar2 == '\x03') {
        *nrune = 1;
        return (Rune *)&re->arguments;
      }
LAB_004928b6:
      *nrune = 0;
      return (Rune *)0x0;
    }
    if (re->nsub_ == 0) {
      *flags = re->parse_flags_ & FoldCase;
      goto LAB_004928b6;
    }
    if (re->nsub_ == 1) {
      paVar1 = &re->field_5;
    }
    else {
      paVar1 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(re->field_5).submany_;
    }
    re = paVar1->subone_;
    uVar2 = re->op_;
  } while( true );
}

Assistant:

Rune* Regexp::LeadingString(Regexp* re, int *nrune,
                            Regexp::ParseFlags *flags) {
  while (re->op() == kRegexpConcat && re->nsub() > 0)
    re = re->sub()[0];

  *flags = static_cast<Regexp::ParseFlags>(re->parse_flags_ & Regexp::FoldCase);

  if (re->op() == kRegexpLiteral) {
    *nrune = 1;
    return &re->arguments.rune_;
  }

  if (re->op() == kRegexpLiteralString) {
    *nrune = re->arguments.literal_string.nrunes_;
    return re->arguments.literal_string.runes_;
  }

  *nrune = 0;
  return NULL;
}